

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * pbrt::Scale(Transform *__return_storage_ptr__,Float x,Float y,Float z)

{
  undefined1 auVar1 [16];
  
  (__return_storage_ptr__->m).m[0][0] = x;
  auVar1._0_12_ = ZEXT412(0);
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])((__return_storage_ptr__->m).m[0] + 1) = auVar1;
  (__return_storage_ptr__->m).m[1][1] = y;
  *(undefined1 (*) [16])((__return_storage_ptr__->m).m[1] + 2) = auVar1;
  (__return_storage_ptr__->m).m[2][2] = z;
  *(undefined1 (*) [16])((__return_storage_ptr__->m).m[2] + 3) = auVar1;
  (__return_storage_ptr__->m).m[3][3] = 1.0;
  (__return_storage_ptr__->mInv).m[0][0] = 1.0 / x;
  *(undefined1 (*) [16])((__return_storage_ptr__->mInv).m[0] + 1) = auVar1;
  (__return_storage_ptr__->mInv).m[1][1] = 1.0 / y;
  *(undefined1 (*) [16])((__return_storage_ptr__->mInv).m[1] + 2) = auVar1;
  (__return_storage_ptr__->mInv).m[2][2] = 1.0 / z;
  *(undefined1 (*) [16])((__return_storage_ptr__->mInv).m[2] + 3) = auVar1;
  (__return_storage_ptr__->mInv).m[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Transform Scale(Float x, Float y, Float z) {
    SquareMatrix<4> m(x, 0, 0, 0,
                      0, y, 0, 0,
                      0, 0, z, 0,
                      0, 0, 0, 1);
    SquareMatrix<4> minv(1 / x,     0,     0, 0,
                             0, 1 / y,     0, 0,
                             0,     0, 1 / z, 0,
                             0,     0,     0, 1);
    return Transform(m, minv);
}